

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curltest.c
# Opt level: O3

int test_curl(char *url)

{
  FILE *__stream;
  int iVar1;
  CURLcode error;
  char *pcVar2;
  char *pcVar3;
  char *__s1;
  CURL_conflict *data;
  ulong uVar4;
  char cVar5;
  char proxy [1024];
  Curl_easy *in_stack_fffffffffffffbd8;
  
  pcVar2 = getenv("HTTP_PROXY");
  if (pcVar2 == (char *)0x0) {
    cVar5 = '\0';
  }
  else {
    pcVar3 = getenv("HTTP_PROXY_PORT");
    __s1 = getenv("HTTP_PROXY_TYPE");
    if (pcVar3 == (char *)0x0) {
      strcpy(&stack0xfffffffffffffbd8,pcVar2);
    }
    else {
      sprintf(&stack0xfffffffffffffbd8,"%s:%s",pcVar2,pcVar3);
    }
    cVar5 = '\x01';
    if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,"HTTP"), iVar1 != 0)) {
      iVar1 = strcmp(__s1,"SOCKS4");
      if (iVar1 == 0) {
        cVar5 = '\x02';
      }
      else {
        iVar1 = strcmp(__s1,"SOCKS5");
        cVar5 = (iVar1 == 0) * '\x02' + '\x01';
      }
    }
  }
  data = curl_easy_init();
  if (data == (CURL_conflict *)0x0) {
    test_curl_cold_1();
  }
  else {
    curl_easy_setopt(data,CURLOPT_VERBOSE,1);
    curl_easy_setopt(data,CURLOPT_HEADER,1);
    if (cVar5 != '\0') {
      curl_easy_setopt(data,CURLOPT_PROXY,&stack0xfffffffffffffbd8);
      uVar4 = 4;
      if (cVar5 != '\x02') {
        uVar4 = (ulong)((uint)(cVar5 == '\x03') * 5);
      }
      curl_easy_setopt(data,CURLOPT_PROXYTYPE,uVar4);
    }
    curl_easy_setopt(data,CURLOPT_URL,url);
    error = curl_easy_perform(data);
    curl_easy_cleanup(in_stack_fffffffffffffbd8);
    __stream = _stderr;
    if (error == CURLE_OK) {
      return 0;
    }
    pcVar2 = curl_easy_strerror(error);
    fprintf(__stream,"error: fetching \'%s\' failed: %s\n",url,pcVar2);
  }
  return 1;
}

Assistant:

int test_curl(const char* url)
{
  CURL* curl;
  CURLcode r;
  char proxy[1024];
  int proxy_type = 0;
  const char* env_HTTP_PROXY = getenv("HTTP_PROXY");

  if (env_HTTP_PROXY) {
    const char* env_HTTP_PROXY_PORT = getenv("HTTP_PROXY_PORT");
    const char* env_HTTP_PROXY_TYPE = getenv("HTTP_PROXY_TYPE");
    proxy_type = 1;
    if (env_HTTP_PROXY_PORT) {
      sprintf(proxy, "%s:%s", env_HTTP_PROXY, env_HTTP_PROXY_PORT);
    } else {
      sprintf(proxy, "%s", env_HTTP_PROXY);
    }
    if (env_HTTP_PROXY_TYPE) {
      /* HTTP/SOCKS4/SOCKS5 */
      if (strcmp(env_HTTP_PROXY_TYPE, "HTTP") == 0) {
        proxy_type = 1;
      } else if (strcmp(env_HTTP_PROXY_TYPE, "SOCKS4") == 0) {
        proxy_type = 2;
      } else if (strcmp(env_HTTP_PROXY_TYPE, "SOCKS5") == 0) {
        proxy_type = 3;
      }
    }
  }

  curl = curl_easy_init();
  if (!curl) {
    fprintf(stderr, "curl_easy_init failed\n");
    return 1;
  }

  curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
  curl_easy_setopt(curl, CURLOPT_HEADER, 1);

  if (proxy_type > 0) {
    curl_easy_setopt(curl, CURLOPT_PROXY, proxy);
    switch (proxy_type) {
      case 2:
        curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
        break;
      case 3:
        curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
        break;
      default:
        curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
    }
  }

  curl_easy_setopt(curl, CURLOPT_URL, url);
  r = curl_easy_perform(curl);
  curl_easy_cleanup(curl);

  if (r != CURLE_OK) {
    fprintf(stderr, "error: fetching '%s' failed: %s\n", url,
            curl_easy_strerror(r));
    return 1;
  }

  return 0;
}